

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

int encode_ulong_value(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,uint64_t value,
                      _Bool use_smallest)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  undefined7 in_register_00000009;
  char *pcVar4;
  uchar local_21;
  uchar local_20;
  uchar local_1f;
  uchar local_1e;
  uchar local_1d;
  uchar local_1c;
  uchar local_1b;
  uchar local_1a;
  uchar local_19;
  
  if ((int)CONCAT71(in_register_00000009,use_smallest) == 0) {
    local_1f = (uchar)(value >> 0x38);
    iVar1 = (*encoder_output)(context,&local_1f,1);
    if (iVar1 == 0) {
      local_1e = (uchar)(value >> 0x30);
      iVar1 = (*encoder_output)(context,&local_1e,1);
      if (iVar1 == 0) {
        local_1d = (uchar)(value >> 0x28);
        iVar1 = (*encoder_output)(context,&local_1d,1);
        if (iVar1 == 0) {
          local_1c = (uchar)(value >> 0x20);
          iVar1 = (*encoder_output)(context,&local_1c,1);
          if (iVar1 == 0) {
            local_1b = (uchar)(value >> 0x18);
            iVar1 = (*encoder_output)(context,&local_1b,1);
            if (iVar1 == 0) {
              local_1a = (uchar)(value >> 0x10);
              iVar1 = (*encoder_output)(context,&local_1a,1);
              if (iVar1 == 0) {
                local_21 = (uchar)(value >> 8);
                iVar1 = (*encoder_output)(context,&local_21,1);
                if ((iVar1 == 0) &&
                   (local_19 = (uchar)value, iVar1 = (*encoder_output)(context,&local_19,1),
                   iVar1 == 0)) {
                  return 0;
                }
              }
            }
          }
        }
      }
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xac6;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xac6;
    }
    pcVar4 = "Failed encoding ulong value";
    iVar3 = 0xac5;
  }
  else {
    local_20 = (uchar)value;
    iVar1 = (*encoder_output)(context,&local_20,1);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xab0;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xab0;
    }
    pcVar4 = "Failed encoding small ulong value";
    iVar3 = 0xaaf;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
            ,"encode_ulong_value",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

static int encode_ulong_value(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, uint64_t value, bool use_smallest)
{
    int result;

    if (use_smallest)
    {
        /* smallulong */
        /* Codes_SRS_AMQPVALUE_01_281: [<encoding name="smallulong" code="0x53" category="fixed" width="1" label="unsigned long value in the range 0 to 255 inclusive"/>] */
        if (output_byte(encoder_output, context, value & 0xFF) != 0)
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding small ulong value");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_280: [<encoding code="0x80" category="fixed" width="8" label="64-bit unsigned integer in network byte order"/>] */
        if ((output_byte(encoder_output, context, (value >> 56) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (value >> 48) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (value >> 40) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (value >> 32) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (value >> 24) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (value >> 16) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (value >> 8) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, value & 0xFF) != 0))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding ulong value");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }

    return result;
}